

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

CTxOut * wallet::FindNonChangeParentOutput(CWallet *wallet,COutPoint *outpoint)

{
  uint32_t uVar1;
  element_type *peVar2;
  pointer hash;
  element_type *peVar3;
  pointer pCVar4;
  bool bVar5;
  isminetype iVar6;
  CWalletTx **ppCVar7;
  CWalletTx *pCVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  long in_FS_OFFSET;
  CWalletTx *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = CWallet::GetWalletTx(wallet,(uint256 *)outpoint);
  ppCVar7 = inline_assertion_check<true,wallet::CWalletTx_const*>
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                       ,0x1e2,"FindNonChangeParentOutput","wallet.GetWalletTx(outpoint.hash)");
  pCVar8 = *ppCVar7;
  puVar11 = &outpoint->n;
  do {
    peVar2 = (pCVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = *puVar11;
    bVar5 = OutputIsChange(wallet,(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (int)uVar1);
    if ((!bVar5) ||
       (hash = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start,
       (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish == hash)) break;
    pCVar8 = CWallet::GetWalletTx(wallet,(uint256 *)hash);
    if (pCVar8 == (CWalletTx *)0x0) break;
    peVar3 = (pCVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar4 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) * -0x3333333333333333;
    uVar9 = (ulong)(hash->prevout).n;
    if (uVar10 < uVar9 || uVar10 - uVar9 == 0) break;
    puVar11 = &(hash->prevout).n;
    iVar6 = CWallet::IsMine(wallet,pCVar4 + uVar9);
  } while (iVar6 != ISMINE_NO);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start + (int)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

const CTxOut& FindNonChangeParentOutput(const CWallet& wallet, const COutPoint& outpoint)
{
    AssertLockHeld(wallet.cs_wallet);
    const CWalletTx* wtx{Assert(wallet.GetWalletTx(outpoint.hash))};

    const CTransaction* ptx = wtx->tx.get();
    int n = outpoint.n;
    while (OutputIsChange(wallet, ptx->vout[n]) && ptx->vin.size() > 0) {
        const COutPoint& prevout = ptx->vin[0].prevout;
        const CWalletTx* it = wallet.GetWalletTx(prevout.hash);
        if (!it || it->tx->vout.size() <= prevout.n ||
            !wallet.IsMine(it->tx->vout[prevout.n])) {
            break;
        }
        ptx = it->tx.get();
        n = prevout.n;
    }
    return ptx->vout[n];
}